

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::~BufferCopyFromBuffer(BufferCopyFromBuffer *this)

{
  BufferCopyFromBuffer *this_local;
  
  ~BufferCopyFromBuffer(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~BufferCopyFromBuffer	(void) {}